

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

CompilerHLSL * __thiscall
spirv_cross::CompilerHLSL::builtin_to_glsl_abi_cxx11_
          (CompilerHLSL *this,BuiltIn builtin,StorageClass storage)

{
  uint32_t id;
  CompilerError *this_00;
  string *ts_2;
  undefined4 in_register_00000034;
  Compiler *this_01;
  allocator local_a0;
  allocator local_9f;
  allocator local_9e;
  allocator local_9d;
  uint32_t local_9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [39];
  undefined1 local_71;
  SPIRType *local_70;
  SPIRType *type;
  SPIRVariable *var;
  string local_58 [35];
  allocator local_35 [20];
  allocator local_21 [5];
  StorageClass local_1c;
  StorageClass storage_local;
  BuiltIn builtin_local;
  CompilerHLSL *this_local;
  string *ret;
  
  this_01 = (Compiler *)CONCAT44(in_register_00000034,builtin);
  local_1c = storage;
  _storage_local = this_01;
  this_local = this;
  switch(storage) {
  case StorageClassCrossWorkgroup:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_VertexID",local_21);
    ::std::allocator<char>::~allocator((allocator<char> *)local_21);
    break;
  case StorageClassPrivate:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_InstanceID",local_35);
    ::std::allocator<char>::~allocator((allocator<char> *)local_35);
    break;
  default:
    CompilerGLSL::builtin_to_glsl_abi_cxx11_(&this->super_CompilerGLSL,builtin,storage);
    break;
  case 0x10:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"float2(0.5f, 0.5f)",&local_9d);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_9d);
    break;
  case 0x17:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"IsHelperLane()",&local_a0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_a0);
    break;
  case 0x18:
    if (*(int *)(this_01[3].ir.ids_for_type[7].stack_storage.aligned_char + 8) == 0) {
      var._6_1_ = 1;
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_58,
                 "NumWorkgroups builtin is used, but remap_num_workgroups_builtin() was not called. Cannot emit code for this builtin."
                 ,(allocator *)((long)&var + 7));
      CompilerError::CompilerError(this_00,(string *)local_58);
      var._6_1_ = 0;
      __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    type = (SPIRType *)
           Compiler::get<spirv_cross::SPIRVariable>
                     (this_01,*(uint32_t *)
                               (this_01[3].ir.ids_for_type[7].stack_storage.aligned_char + 8));
    id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).field_0xc);
    local_70 = Compiler::get<spirv_cross::SPIRType>(this_01,id);
    local_71 = 0;
    (*this_01->_vptr_Compiler[6])
              (local_98,this_01,
               (ulong)*(uint *)(this_01[3].ir.ids_for_type[7].stack_storage.aligned_char + 8),1);
    local_9c = (uint32_t)
               TypedID::operator_cast_to_TypedID((TypedID *)&(local_70->super_IVariant).self);
    ts_2 = Compiler::get_member_name_abi_cxx11_(this_01,(TypeID)local_9c,0);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&>
              ((spirv_cross *)this,local_98,(char (*) [2])0x5b8878,ts_2);
    ::std::__cxx11::string::~string((string *)local_98);
    ParsedIR::sanitize_underscores((string *)this);
    break;
  case 0x24:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"WaveGetLaneCount()",&local_9f);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_9f);
    break;
  case 0x29:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"WaveGetLaneIndex()",&local_9e);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_9e);
  }
  return this;
}

Assistant:

std::string CompilerHLSL::builtin_to_glsl(spv::BuiltIn builtin, spv::StorageClass storage)
{
	switch (builtin)
	{
	case BuiltInVertexId:
		return "gl_VertexID";
	case BuiltInInstanceId:
		return "gl_InstanceID";
	case BuiltInNumWorkgroups:
	{
		if (!num_workgroups_builtin)
			SPIRV_CROSS_THROW("NumWorkgroups builtin is used, but remap_num_workgroups_builtin() was not called. "
			                  "Cannot emit code for this builtin.");

		auto &var = get<SPIRVariable>(num_workgroups_builtin);
		auto &type = get<SPIRType>(var.basetype);
		auto ret = join(to_name(num_workgroups_builtin), "_", get_member_name(type.self, 0));
		ParsedIR::sanitize_underscores(ret);
		return ret;
	}
	case BuiltInPointCoord:
		// Crude hack, but there is no real alternative. This path is only enabled if point_coord_compat is set.
		return "float2(0.5f, 0.5f)";
	case BuiltInSubgroupLocalInvocationId:
		return "WaveGetLaneIndex()";
	case BuiltInSubgroupSize:
		return "WaveGetLaneCount()";
	case BuiltInHelperInvocation:
		return "IsHelperLane()";

	default:
		return CompilerGLSL::builtin_to_glsl(builtin, storage);
	}
}